

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O1

void __thiscall
flatbuffers::kotlin::KotlinGenerator::KotlinGenerator
          (KotlinGenerator *this,Parser *parser,string *path,string *file_name)

{
  KotlinGenerator *pKVar1;
  long *plVar2;
  long lVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Config result;
  allocator_type local_72a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_729;
  KotlinGenerator *local_728;
  string local_720;
  string local_700;
  string local_6e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6c0;
  Config local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  undefined2 *local_520;
  undefined8 local_518;
  undefined2 local_510;
  undefined1 local_50e;
  undefined8 *local_500;
  undefined8 local_4f8;
  undefined8 local_4f0;
  undefined2 local_4e8;
  undefined4 *local_4e0;
  undefined8 local_4d8;
  undefined4 local_4d0;
  undefined2 local_4cc;
  undefined4 *local_4c0;
  undefined8 local_4b8;
  undefined4 local_4b0;
  undefined1 local_4ac;
  undefined4 *local_4a0;
  undefined8 local_498;
  undefined4 local_490;
  undefined2 local_48c;
  undefined4 *local_480;
  undefined8 local_478;
  undefined4 local_470 [4];
  undefined4 *local_460;
  undefined8 local_458;
  undefined4 local_450 [4];
  undefined4 *local_440;
  undefined8 local_438;
  undefined4 local_430 [4];
  undefined2 *local_420;
  undefined8 local_418;
  undefined2 local_410;
  undefined1 local_40e;
  undefined1 local_40d;
  undefined4 *local_400;
  undefined8 local_3f8;
  undefined4 local_3f0;
  undefined1 local_3ec;
  undefined4 *local_3e0;
  undefined8 local_3d8;
  undefined4 local_3d0;
  undefined1 local_3cc;
  undefined4 *local_3c0;
  undefined8 local_3b8;
  undefined4 local_3b0;
  undefined1 local_3ac;
  undefined1 local_3ab;
  undefined2 *local_3a0;
  undefined8 local_398;
  undefined2 local_390;
  undefined1 local_38e;
  undefined2 *local_380;
  undefined8 local_378;
  undefined2 local_370;
  undefined1 local_36e;
  undefined4 *local_360;
  undefined8 local_358;
  undefined4 local_350;
  undefined1 local_34c;
  undefined1 local_34b;
  undefined4 *local_340;
  undefined8 local_338;
  undefined4 local_330;
  undefined2 local_32c;
  undefined1 local_32a;
  undefined4 *local_320;
  undefined8 local_318;
  undefined4 local_310;
  undefined1 local_30c;
  undefined1 local_30b;
  undefined8 *local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined1 local_2e8;
  undefined4 *local_2e0;
  undefined8 local_2d8;
  undefined4 local_2d0;
  undefined2 local_2cc;
  undefined1 local_2ca;
  undefined2 *local_2c0;
  undefined8 local_2b8;
  undefined2 local_2b0;
  undefined1 local_2ae;
  undefined2 *local_2a0;
  undefined8 local_298;
  undefined2 local_290;
  undefined1 local_28e;
  undefined1 local_28d;
  undefined4 *local_280;
  undefined8 local_278;
  undefined4 local_270;
  undefined1 local_26c;
  undefined4 *local_260;
  undefined8 local_258;
  undefined4 local_250;
  undefined1 local_24c;
  undefined1 local_24b;
  undefined2 *local_240;
  undefined8 local_238;
  undefined2 local_230;
  undefined1 local_22e;
  undefined4 *local_220;
  undefined8 local_218;
  undefined4 local_210;
  undefined1 local_20c;
  undefined8 *local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8;
  undefined1 local_1e7;
  undefined4 *local_1e0;
  undefined8 local_1d8;
  undefined4 local_1d0;
  undefined2 local_1cc;
  undefined1 local_1ca;
  undefined2 *local_1c0;
  undefined8 local_1b8;
  undefined2 local_1b0;
  undefined1 uStack_1ae;
  undefined1 uStack_1ad;
  long *local_1a0 [2];
  long local_190;
  undefined1 local_188;
  undefined1 local_187;
  undefined1 local_180 [136];
  string local_f8 [104];
  string local_90 [32];
  string local_70 [64];
  
  local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
  local_728 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_720,"");
  local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_700,".","");
  local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e0,"kt","");
  pKVar1 = local_728;
  BaseGenerator::BaseGenerator
            (&local_728->super_BaseGenerator,parser,path,file_name,&local_720,&local_700,&local_6e0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
    operator_delete(local_6e0._M_dataplus._M_p,local_6e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_700._M_dataplus._M_p != &local_700.field_2) {
    operator_delete(local_700._M_dataplus._M_p,local_700.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_720._M_dataplus._M_p != &local_720.field_2) {
    operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
  }
  (pKVar1->super_BaseGenerator)._vptr_BaseGenerator = (_func_int **)&PTR_generate_003f2e70;
  local_690.enum_variant_seperator._M_dataplus._M_p =
       (pointer)&local_690.enum_variant_seperator.field_2;
  local_690.types = kKeep;
  local_690.constants = kKeep;
  local_690.methods = kLowerCamel;
  local_690.functions = kKeep;
  local_690.fields = kLowerCamel;
  local_690.variables = kLowerCamel;
  local_690.variants = kKeep;
  local_690.enum_variant_seperator._M_string_length = 0;
  local_690.enum_variant_seperator.field_2._M_local_buf[0] = '\0';
  local_690.escape_keywords = BeforeConvertingCase;
  local_690.namespaces = kKeep;
  local_690.namespace_seperator._M_dataplus._M_p = (pointer)&local_690.namespace_seperator.field_2;
  local_690.namespace_seperator.field_2._M_allocated_capacity._0_2_ = 0x5f5f;
  local_690.namespace_seperator._M_string_length = 2;
  local_690.namespace_seperator.field_2._M_local_buf[2] = '\0';
  local_690.object_prefix._M_dataplus._M_p = (pointer)&local_690.object_prefix.field_2;
  local_690.object_prefix._M_string_length = 0;
  local_690.object_prefix.field_2._M_local_buf[0] = '\0';
  local_690.object_suffix._M_dataplus._M_p = (pointer)&local_690.object_suffix.field_2;
  local_690.object_suffix.field_2._M_allocated_capacity._0_2_ = 0x54;
  local_690.object_suffix._M_string_length = 1;
  local_690.keyword_prefix._M_dataplus._M_p = (pointer)&local_690.keyword_prefix.field_2;
  local_690.keyword_prefix._M_string_length = 0;
  local_690.keyword_prefix.field_2._M_local_buf[0] = '\0';
  local_690.keyword_suffix._M_dataplus._M_p = (pointer)&local_690.keyword_suffix.field_2;
  local_690.keyword_suffix.field_2._M_local_buf[0] = '_';
  local_690.keyword_suffix._M_string_length = 1;
  local_690.keyword_suffix.field_2._M_local_buf[1] = '\0';
  local_690.filenames = kKeep;
  local_690.directories = kKeep;
  local_690.output_path._M_dataplus._M_p = (pointer)&local_690.output_path.field_2;
  local_690.output_path._M_string_length = 0;
  local_690.output_path.field_2._M_local_buf[0] = '\0';
  local_690.filename_suffix._M_dataplus._M_p = (pointer)&local_690.filename_suffix.field_2;
  local_690.filename_suffix._M_string_length = 0;
  local_690.filename_suffix.field_2._M_local_buf[0] = '\0';
  local_690.filename_extension._M_dataplus._M_p = (pointer)&local_690.filename_extension.field_2;
  local_690.filename_extension.field_2._M_allocated_capacity._0_4_ = 0x746b2e;
  local_690.filename_extension._M_string_length = 3;
  Namer::Config::Config((Config *)local_180,&local_690);
  std::__cxx11::string::_M_assign((string *)(local_180 + 0x68));
  std::__cxx11::string::_M_assign(local_f8);
  std::__cxx11::string::_M_assign(local_90);
  std::__cxx11::string::_M_assign(local_70);
  local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
  local_540.field_2._M_allocated_capacity._0_4_ = 0x6b636170;
  local_540.field_2._M_allocated_capacity._4_3_ = 0x656761;
  local_540._M_string_length = 7;
  local_540.field_2._M_local_buf[7] = '\0';
  local_520 = &local_510;
  local_510 = 0x7361;
  local_518 = 2;
  local_50e = 0;
  local_500 = &local_4f0;
  local_4f0 = 0x61696c6165707974;
  local_4e8 = 0x73;
  local_4f8 = 9;
  local_4e0 = &local_4d0;
  local_4cc = 0x73;
  local_4d0 = 0x73616c63;
  local_4d8 = 5;
  local_4c0 = &local_4b0;
  local_4b0 = 0x73696874;
  local_4b8 = 4;
  local_4ac = 0;
  local_4a0 = &local_490;
  local_490 = 0x65707573;
  local_48c = 0x72;
  local_498 = 5;
  local_480 = local_470;
  local_470[0] = 0x6c6176;
  local_478 = 3;
  local_460 = local_450;
  local_450[0] = 0x726176;
  local_458 = 3;
  local_440 = local_430;
  local_430[0] = 0x6e7566;
  local_438 = 3;
  local_420 = &local_410;
  local_40e = 0x72;
  local_410 = 0x6f66;
  local_418 = 3;
  local_40d = 0;
  local_400 = &local_3f0;
  local_3f0 = 0x6c6c756e;
  local_3f8 = 4;
  local_3ec = 0;
  local_3e0 = &local_3d0;
  local_3d0 = 0x65757274;
  local_3d8 = 4;
  local_3cc = 0;
  local_3c0 = &local_3b0;
  local_3ac = 0x65;
  local_3b0 = 0x736c6166;
  local_3b8 = 5;
  local_3ab = 0;
  local_3a0 = &local_390;
  local_390 = 0x7369;
  local_398 = 2;
  local_38e = 0;
  local_380 = &local_370;
  local_370 = 0x6e69;
  local_378 = 2;
  local_36e = 0;
  local_360 = &local_350;
  local_34c = 0x77;
  local_350 = 0x6f726874;
  local_358 = 5;
  local_34b = 0;
  local_340 = &local_330;
  local_32c = 0x6e72;
  local_330 = 0x75746572;
  local_338 = 6;
  local_32a = 0;
  local_320 = &local_310;
  local_30c = 0x6b;
  local_310 = 0x61657262;
  local_318 = 5;
  local_30b = 0;
  local_300 = &local_2f0;
  local_2f0 = 0x65756e69746e6f63;
  local_2f8 = 8;
  local_2e8 = 0;
  local_2e0 = &local_2d0;
  local_2cc = 0x7463;
  local_2d0 = 0x656a626f;
  local_2d8 = 6;
  local_2ca = 0;
  local_2c0 = &local_2b0;
  local_2b0 = 0x6669;
  local_2b8 = 2;
  local_2ae = 0;
  local_2a0 = &local_290;
  local_28e = 0x79;
  local_290 = 0x7274;
  local_298 = 3;
  local_28d = 0;
  local_280 = &local_270;
  local_270 = 0x65736c65;
  local_278 = 4;
  local_26c = 0;
  local_260 = &local_250;
  local_24c = 0x65;
  local_250 = 0x6c696877;
  local_258 = 5;
  local_24b = 0;
  local_240 = &local_230;
  local_230 = 0x6f64;
  local_238 = 2;
  local_22e = 0;
  local_220 = &local_210;
  local_210 = 0x6e656877;
  local_218 = 4;
  local_20c = 0;
  local_200 = &local_1f0;
  local_1e8 = 0x65;
  local_1f0 = 0x6361667265746e69;
  local_1f8 = 9;
  local_1e7 = 0;
  local_1e0 = &local_1d0;
  local_1cc = 0x666f;
  local_1d0 = 0x65707974;
  local_1d8 = 6;
  local_1ca = 0;
  local_1c0 = &local_1b0;
  uStack_1ae = 0x79;
  local_1b0 = 0x6e41;
  local_1b8 = 3;
  uStack_1ad = 0;
  plVar2 = &local_190;
  local_188 = 0x72;
  local_190 = 0x6574636172616843;
  local_1a0[1] = (long *)0x9;
  local_187 = 0;
  __l._M_len = 0x1e;
  __l._M_array = &local_540;
  local_1a0[0] = plVar2;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_6c0,__l,&local_729,&local_72a);
  lVar3 = -0x3c0;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  IdlNamer::IdlNamer(&pKVar1->namer_,(Config *)local_180,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_6c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_6c0);
  Namer::Config::~Config((Config *)local_180);
  Namer::Config::~Config(&local_690);
  return;
}

Assistant:

KotlinGenerator(const Parser &parser, const std::string &path,
                  const std::string &file_name)
      : BaseGenerator(parser, path, file_name, "", ".", "kt"),
        namer_(WithFlagOptions(KotlinDefaultConfig(), parser.opts, path),
               KotlinKeywords()) {}